

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O3

UChar32 ucptrie_internalGetRange_63
                  (UCPTrieGetRange *getRange,void *trie,UChar32 start,UCPMapRangeOption option,
                  uint32_t surrogateValue,UCPMapValueFilter *filter,void *context,uint32_t *pValue)

{
  uint uVar1;
  UChar32 UVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint32_t local_38;
  uint32_t local_34;
  
  if (option == UCPMAP_RANGE_NORMAL) {
    UVar2 = (*getRange)(trie,start,filter,context,pValue);
    return UVar2;
  }
  puVar4 = &local_34;
  if (pValue != (uint32_t *)0x0) {
    puVar4 = pValue;
  }
  uVar3 = (uint)(option == UCPMAP_RANGE_FIXED_ALL_SURROGATES) << 10 | 0xdbff;
  uVar1 = (*getRange)(trie,start,filter,context,puVar4);
  if (start <= (int)uVar3 && 0xd7fe < (int)uVar1) {
    if (*puVar4 == surrogateValue) {
      if (uVar3 <= uVar1) {
        return uVar1;
      }
    }
    else {
      if (start < 0xd800) {
        return 0xd7ff;
      }
      *puVar4 = surrogateValue;
      if (uVar3 < uVar1) {
        return uVar3;
      }
    }
    uVar1 = (*getRange)(trie,uVar3 + 1,filter,context,&local_38);
    if (local_38 != surrogateValue) {
      uVar1 = uVar3;
    }
  }
  return uVar1;
}

Assistant:

U_CFUNC UChar32
ucptrie_internalGetRange(UCPTrieGetRange *getRange,
                         const void *trie, UChar32 start,
                         UCPMapRangeOption option, uint32_t surrogateValue,
                         UCPMapValueFilter *filter, const void *context, uint32_t *pValue) {
    if (option == UCPMAP_RANGE_NORMAL) {
        return getRange(trie, start, filter, context, pValue);
    }
    uint32_t value;
    if (pValue == nullptr) {
        // We need to examine the range value even if the caller does not want it.
        pValue = &value;
    }
    UChar32 surrEnd = option == UCPMAP_RANGE_FIXED_ALL_SURROGATES ? 0xdfff : 0xdbff;
    UChar32 end = getRange(trie, start, filter, context, pValue);
    if (end < 0xd7ff || start > surrEnd) {
        return end;
    }
    // The range overlaps with surrogates, or ends just before the first one.
    if (*pValue == surrogateValue) {
        if (end >= surrEnd) {
            // Surrogates followed by a non-surrogateValue range,
            // or surrogates are part of a larger surrogateValue range.
            return end;
        }
    } else {
        if (start <= 0xd7ff) {
            return 0xd7ff;  // Non-surrogateValue range ends before surrogateValue surrogates.
        }
        // Start is a surrogate with a non-surrogateValue code *unit* value.
        // Return a surrogateValue code *point* range.
        *pValue = surrogateValue;
        if (end > surrEnd) {
            return surrEnd;  // Surrogate range ends before non-surrogateValue rest of range.
        }
    }
    // See if the surrogateValue surrogate range can be merged with
    // an immediately following range.
    uint32_t value2;
    UChar32 end2 = getRange(trie, surrEnd + 1, filter, context, &value2);
    if (value2 == surrogateValue) {
        return end2;
    }
    return surrEnd;
}